

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double wolfe_eval(vw *all,bfgs *b,float *mem,double loss_sum,double previous_loss_sum,
                 double step_size,double importance_weight_sum,int *origin,double *wolfe1)

{
  long in_RDI;
  double *in_stack_00000050;
  sparse_parameters *in_stack_00000058;
  double *in_stack_00000060;
  int *in_stack_00000068;
  double in_stack_00000070;
  double in_stack_00000078;
  float *in_stack_00000080;
  bfgs *in_stack_00000088;
  vw *in_stack_00000090;
  bfgs *in_stack_00000098;
  vw *in_stack_000000a0;
  undefined8 local_8;
  
  if ((*(byte *)(in_RDI + 0x3590) & 1) == 0) {
    local_8 = wolfe_eval<dense_parameters>
                        (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                         in_stack_00000070,(double)in_stack_00000068,(double)in_stack_00000060,
                         (int *)in_stack_00000058,in_stack_00000050,(dense_parameters *)all);
  }
  else {
    local_8 = wolfe_eval<sparse_parameters>
                        (in_stack_000000a0,in_stack_00000098,(float *)in_stack_00000090,
                         (double)in_stack_00000088,(double)in_stack_00000080,in_stack_00000078,
                         in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  return local_8;
}

Assistant:

double wolfe_eval(vw& all, bfgs& b, float* mem, double loss_sum, double previous_loss_sum, double step_size,
    double importance_weight_sum, int& origin, double& wolfe1)
{
  if (all.weights.sparse)
    return wolfe_eval(all, b, mem, loss_sum, previous_loss_sum, step_size, importance_weight_sum, origin, wolfe1,
        all.weights.sparse_weights);
  else
    return wolfe_eval(all, b, mem, loss_sum, previous_loss_sum, step_size, importance_weight_sum, origin, wolfe1,
        all.weights.dense_weights);
}